

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::moveAppend
          (QGenericArrayOps<QKmsPlane> *this,QKmsPlane *b,QKmsPlane *e)

{
  QKmsPlane *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QKmsPlane *in_RDI;
  QKmsPlane *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QKmsPlane>::begin((QArrayDataPointer<QKmsPlane> *)0x133807);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QKmsPlane::QKmsPlane(this_00,in_RDI);
      local_10 = local_10 + 0x68;
      (in_RDI->supportedFormats).d.d =
           (Data *)((long)&(((in_RDI->supportedFormats).d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }